

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.h
# Opt level: O2

void SHA1_input(SHA1_CTX *context,uchar *data,size_t len)

{
  uint uVar1;
  uint uVar3;
  ulong __n;
  ulong uVar2;
  
  uVar1 = context->count[0];
  uVar3 = (int)len * 8;
  context->count[0] = uVar3 + uVar1;
  context->count[1] = context->count[1] + (int)(len >> 0x1d) + (uint)CARRY4(uVar3,uVar1);
  uVar1 = uVar1 >> 3 & 0x3f;
  uVar2 = (ulong)uVar1;
  if (uVar2 + len < 0x40) {
    __n = 0;
  }
  else {
    __n = (ulong)(0x40 - uVar1);
    memcpy(context->buffer + uVar2,data,__n);
    SHA1_transform(context->state,context->buffer);
    for (; (int)__n + 0x3f < len; __n = (ulong)((int)__n + 0x40)) {
      SHA1_transform(context->state,data + __n);
    }
    uVar2 = 0;
  }
  memcpy(context->buffer + uVar2,data + __n,len - __n);
  return;
}

Assistant:

void SHA1_input(SHA1_CTX* context, const unsigned char* data, size_t len)
{
	uint32_t i = 0;
	uint32_t j = context->count[0];

	if ((context->count[0] += len << 3) < j)
		context->count[1]++;

	context->count[1] += (len >> 29);
	j = (j >> 3) & 63;

	if ((j + len) > 63)
	{
		memcpy(&context->buffer[j], data, (i = 64 - j));
		SHA1_transform(context->state, context->buffer);

		for (; i + 63 < len; i += 64)
			SHA1_transform(context->state, &data[i]);

		j = 0;
	}

	memcpy(&context->buffer[j], &data[i], len - i);
}